

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_free_list_add(Tree *this,size_t i)

{
  pfn_error p_Var1;
  NodeData *pNVar2;
  size_t sVar3;
  code *pcVar4;
  Location LVar5;
  bool bVar6;
  csubstr cVar7;
  char *pcStack_58;
  size_t local_50;
  char msg [36];
  
  if (this->m_cap <= i) {
    builtin_strncpy(msg,"check failed: (i >= 0 && i < m_cap)",0x24);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar7.len;
    pcStack_58 = cVar7.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x638e) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x638e) << 0x40,8);
    LVar5.name.str = pcStack_58;
    LVar5.name.len = local_50;
    (*p_Var1)(msg,0x24,LVar5,(this->m_callbacks).m_user_data);
  }
  pNVar2 = this->m_buf;
  pNVar2[i].m_parent = 0xffffffffffffffff;
  sVar3 = this->m_free_head;
  pNVar2[i].m_next_sibling = sVar3;
  pNVar2[i].m_prev_sibling = 0xffffffffffffffff;
  if (sVar3 != 0xffffffffffffffff) {
    pNVar2[sVar3].m_prev_sibling = i;
  }
  this->m_free_head = i;
  if (this->m_free_tail == 0xffffffffffffffff) {
    this->m_free_tail = i;
  }
  return;
}

Assistant:

void Tree::_free_list_add(size_t i)
{
    _RYML_CB_ASSERT(m_callbacks, i >= 0 && i < m_cap);
    NodeData &C4_RESTRICT w = m_buf[i];

    w.m_parent = NONE;
    w.m_next_sibling = m_free_head;
    w.m_prev_sibling = NONE;
    if(m_free_head != NONE)
        m_buf[m_free_head].m_prev_sibling = i;
    m_free_head = i;
    if(m_free_tail == NONE)
        m_free_tail = m_free_head;
}